

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

double __thiscall BRTS_XZ<UF>::Alloc(BRTS_XZ<UF> *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  uint64_t *puVar10;
  Run *pRVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Mat local_70 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar13 = *(int *)&pMVar4->field_0xc;
  dVar7 = UF::Alloc(((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1) *
                    ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1,
                    &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar9 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar9;
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar13 = *(int *)&pMVar4->field_0xc;
  (this->data_compressed).height = iVar2;
  (this->data_compressed).width = iVar13;
  iVar12 = iVar13 + 0x3f;
  if (-1 < iVar13) {
    iVar12 = iVar13;
  }
  iVar13 = (iVar12 >> 6) + 1;
  (this->data_compressed).data_width = iVar13;
  uVar14 = iVar13 * iVar2;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (int)uVar14) {
    uVar15 = (ulong)uVar14 * 8;
  }
  puVar10 = (uint64_t *)operator_new__(uVar15);
  (this->data_compressed).bits = puVar10;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  lVar9 = cv::getTickCount();
  dVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar14 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  (this->data_runs).height = uVar14;
  (this->data_runs).width = uVar3;
  dVar16 = (double)lVar9 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total;
  pRVar11 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * uVar14 + 1) << 3);
  (this->data_runs).runs = pRVar11;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar16;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar1 + dVar16;
  lVar9 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar9;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  lVar9 = cv::getTickCount();
  dVar1 = (double)lVar9 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar1;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar1 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  auVar17._0_8_ = dVar16 * 1000.0;
  auVar17._8_8_ = dVar1 * 1000.0;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar18._8_4_ = SUB84(dVar1,0);
  auVar18._0_8_ = dVar8;
  auVar18._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar18 = divpd(auVar17,auVar18);
  return dVar7 + (auVar18._0_8_ - auVar18._8_8_);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(img_.rows, img_.cols);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(img_.rows, img_.cols);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }